

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O1

void aom_highbd_quantize_b_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint *puVar1;
  int *piVar2;
  uint *puVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined4 unaff_EBX;
  int iVar39;
  long lVar40;
  uint16_t uVar41;
  short *psVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  ushort uVar46;
  ushort uVar48;
  ushort uVar49;
  int iVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  undefined1 auVar47 [16];
  ushort uVar55;
  ushort uVar56;
  int iVar57;
  ushort uVar67;
  ushort uVar68;
  int iVar69;
  ushort uVar70;
  int iVar71;
  undefined1 in_XMM1 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar72;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar73;
  int iVar74;
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar86;
  uint uVar92;
  uint uVar93;
  uint uVar94;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar95;
  uint uVar104;
  uint uVar105;
  uint uVar106;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  uint uVar123;
  uint uVar137;
  uint uVar138;
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  uint uVar139;
  uint uVar140;
  uint uVar142;
  uint uVar143;
  undefined1 auVar141 [16];
  uint uVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  int iVar148;
  int iVar151;
  int iVar152;
  int iVar153;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  int iVar157;
  undefined1 auVar154 [16];
  uint uVar158;
  uint uVar165;
  uint uVar166;
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  uint uVar167;
  undefined1 auVar164 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 local_148 [16];
  __m128i sign_hi_4;
  __m128i sign_lo_4;
  __m128i sign_lo_1;
  __m128i sign_hi_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  
  auVar58 = pshuflw(in_XMM1,ZEXT416(*(uint *)dequant_ptr),0xd4);
  auVar59 = pmaddwd(auVar58,_DAT_00514960);
  auVar47 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  iVar50 = (auVar47._4_4_ >> 0x10) * 0x20 + -1 + (auVar59._4_4_ + 0x40 >> 7);
  auVar58 = *(undefined1 (*) [16])zbin_ptr;
  auVar136 = *(undefined1 (*) [16])round_ptr;
  auVar174 = *(undefined1 (*) [16])quant_ptr;
  auVar80 = *(undefined1 (*) [16])dequant_ptr;
  auVar96 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar60 = psraw(auVar58,0xf);
  auVar141._0_12_ = auVar58._0_12_;
  auVar141._12_2_ = auVar58._6_2_;
  auVar141._14_2_ = auVar60._6_2_;
  auVar168._12_4_ = auVar141._12_4_;
  auVar168._0_10_ = auVar58._0_10_;
  auVar168._10_2_ = auVar60._4_2_;
  auVar173._10_6_ = auVar168._10_6_;
  auVar173._0_8_ = auVar58._0_8_;
  auVar173._8_2_ = auVar58._4_2_;
  auVar34._4_8_ = auVar173._8_8_;
  auVar34._2_2_ = auVar60._2_2_;
  auVar34._0_2_ = auVar58._2_2_;
  iVar73 = auVar173._8_4_ + -1;
  iVar74 = auVar168._12_4_ + -1;
  uVar86 = *coeff_ptr >> 0x1f;
  uVar92 = coeff_ptr[1] >> 0x1f;
  uVar93 = coeff_ptr[2] >> 0x1f;
  uVar94 = coeff_ptr[3] >> 0x1f;
  uVar95 = coeff_ptr[4] >> 0x1f;
  uVar104 = coeff_ptr[5] >> 0x1f;
  uVar105 = coeff_ptr[6] >> 0x1f;
  uVar106 = coeff_ptr[7] >> 0x1f;
  iVar148 = (*coeff_ptr ^ uVar86) - uVar86;
  iVar151 = (coeff_ptr[1] ^ uVar92) - uVar92;
  iVar152 = (coeff_ptr[2] ^ uVar93) - uVar93;
  iVar153 = (coeff_ptr[3] ^ uVar94) - uVar94;
  iVar57 = (coeff_ptr[4] ^ uVar95) - uVar95;
  iVar69 = (coeff_ptr[5] ^ uVar104) - uVar104;
  iVar71 = (coeff_ptr[6] ^ uVar105) - uVar105;
  iVar72 = (coeff_ptr[7] ^ uVar106) - uVar106;
  auVar47._0_4_ =
       -(uint)((auVar47._0_4_ >> 0x10) * 0x20 + -1 + (auVar59._0_4_ + 0x40 >> 7) < iVar148 * 0x20);
  auVar47._4_4_ = -(uint)(iVar50 < iVar151 * 0x20);
  auVar47._8_4_ = -(uint)(iVar50 < iVar152 * 0x20);
  auVar47._12_4_ = -(uint)(iVar50 < iVar153 * 0x20);
  auVar59._0_4_ = -(uint)(iVar50 < iVar57 * 0x20);
  auVar59._4_4_ = -(uint)(iVar50 < iVar69 * 0x20);
  auVar59._8_4_ = -(uint)(iVar50 < iVar71 * 0x20);
  auVar59._12_4_ = -(uint)(iVar50 < iVar72 * 0x20);
  auVar59 = packssdw(auVar47,auVar59);
  auVar47 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  bVar25 = (auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar26 = (auVar59 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar59 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = (auVar59 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar45 = auVar59[0xf] < '\0';
  if (((((((((((((((bVar25 || bVar26) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
             bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) ||
      bVar45) {
    local_148 = auVar59 & *(undefined1 (*) [16])iscan;
  }
  bVar45 = ((((((((((((((bVar25 || bVar26) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
                  bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) ||
           bVar12) || bVar45;
  auVar141 = psraw(auVar136,0xf);
  auVar168 = psraw(auVar174,0xf);
  auVar173 = psraw(auVar80,0xf);
  auVar59 = psraw(auVar96,0xf);
  auVar60._0_4_ = -(uint)(CONCAT22(auVar60._0_2_,auVar58._0_2_) + -1 < iVar148);
  auVar60._4_4_ = -(uint)(auVar34._0_4_ + -1 < iVar151);
  auVar60._8_4_ = -(uint)(iVar73 < iVar152);
  auVar60._12_4_ = -(uint)(iVar74 < iVar153);
  auVar145._0_4_ = -(uint)(iVar73 < iVar57);
  auVar145._4_4_ = -(uint)(iVar74 < iVar69);
  auVar145._8_4_ = -(uint)(iVar73 < iVar71);
  auVar145._12_4_ = -(uint)(iVar74 < iVar72);
  auVar58 = packssdw(auVar60,auVar145);
  bVar26 = (auVar58 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar27 = (auVar58 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar25 = (auVar58 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar58 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar58 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar58 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar58 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar58 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar58 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar58 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar58 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar58 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = auVar58[0xf] < '\0';
  if (((((((((((((((bVar26 || bVar27) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
             bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) ||
      bVar12) {
    auVar47 = auVar58 & *(undefined1 (*) [16])iscan;
  }
  bVar12 = ((((((((((((((bVar26 || bVar27) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
                  bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) ||
           bVar13) || bVar12;
  auVar156._0_12_ = auVar136._0_12_;
  auVar156._12_2_ = auVar136._6_2_;
  auVar156._14_2_ = auVar141._6_2_;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar136._0_10_;
  auVar155._10_2_ = auVar141._4_2_;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._0_8_ = auVar136._0_8_;
  auVar154._8_2_ = auVar136._4_2_;
  auVar35._4_8_ = auVar154._8_8_;
  auVar35._2_2_ = auVar141._2_2_;
  auVar35._0_2_ = auVar136._2_2_;
  auVar77._0_12_ = auVar174._0_12_;
  auVar77._12_2_ = auVar174._6_2_;
  auVar77._14_2_ = auVar168._6_2_;
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._0_10_ = auVar174._0_10_;
  auVar76._10_2_ = auVar168._4_2_;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._0_8_ = auVar174._0_8_;
  auVar75._8_2_ = auVar174._4_2_;
  auVar36._4_8_ = auVar75._8_8_;
  auVar36._2_2_ = auVar168._2_2_;
  auVar36._0_2_ = auVar174._2_2_;
  auVar174._2_2_ = auVar168._0_2_;
  auVar174._4_12_ = auVar36;
  auVar161._0_12_ = auVar80._0_12_;
  auVar161._12_2_ = auVar80._6_2_;
  auVar161._14_2_ = auVar173._6_2_;
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._0_10_ = auVar80._0_10_;
  auVar160._10_2_ = auVar173._4_2_;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._0_8_ = auVar80._0_8_;
  auVar159._8_2_ = auVar80._4_2_;
  auVar37._4_8_ = auVar159._8_8_;
  auVar37._2_2_ = auVar173._2_2_;
  auVar37._0_2_ = auVar80._2_2_;
  auVar58._0_2_ = auVar80._0_2_;
  auVar58._2_2_ = auVar173._0_2_;
  auVar58._4_12_ = auVar37;
  auVar126._0_12_ = auVar96._0_12_;
  auVar126._12_2_ = auVar96._6_2_;
  auVar126._14_2_ = auVar59._6_2_;
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._0_10_ = auVar96._0_10_;
  auVar125._10_2_ = auVar59._4_2_;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._0_8_ = auVar96._0_8_;
  auVar124._8_2_ = auVar96._4_2_;
  auVar38._4_8_ = auVar124._8_8_;
  auVar38._2_2_ = auVar59._2_2_;
  auVar38._0_2_ = auVar96._2_2_;
  auVar170._0_2_ = auVar96._0_2_;
  auVar170._2_2_ = auVar59._0_2_;
  auVar170._4_12_ = auVar38;
  iVar39 = movmskps(unaff_EBX,auVar145 | auVar60);
  iVar157 = auVar154._8_4_;
  uVar158 = auVar75._8_4_;
  uVar165 = auVar124._8_4_;
  uVar166 = auVar159._8_4_;
  auVar96._8_4_ = (int)uVar158 >> 0x1f;
  auVar96._12_4_ = (int)auVar76._12_4_ >> 0x1f;
  auVar108._8_4_ = (int)uVar165 >> 0x1f;
  auVar108._12_4_ = (int)auVar125._12_4_ >> 0x1f;
  auVar80._8_4_ = (int)uVar166 >> 0x1f;
  auVar80._12_4_ = (int)auVar160._12_4_ >> 0x1f;
  if (iVar39 == 0) {
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar149._0_4_ = iVar148 + CONCAT22(auVar141._0_2_,auVar136._0_2_);
    auVar149._4_4_ = iVar151 + auVar35._0_4_;
    auVar149._8_4_ = iVar152 + iVar157;
    auVar149._12_4_ = iVar153 + auVar155._12_4_;
    auVar96._0_4_ = (int)auVar168._0_2_ >> 0xf;
    auVar96._4_4_ = auVar36._0_4_ >> 0x1f;
    auVar107._0_8_ = CONCAT44(auVar96._0_4_,auVar96._0_4_);
    auVar107._8_4_ = auVar96._4_4_;
    auVar107._12_4_ = auVar96._4_4_;
    auVar169._0_8_ = CONCAT44(auVar96._8_4_,auVar96._8_4_);
    auVar169._8_4_ = auVar96._12_4_;
    auVar169._12_4_ = auVar96._12_4_;
    auVar174 = auVar174 ^ auVar96;
    auVar175._0_4_ = auVar174._0_4_ - auVar96._0_4_;
    auVar175._4_4_ = auVar174._4_4_ - auVar96._4_4_;
    auVar175._8_4_ = auVar174._8_4_ - auVar96._8_4_;
    auVar175._12_4_ = auVar174._12_4_ - auVar96._12_4_;
    auVar97._0_8_ = (ulong)auVar149._0_4_ * (ulong)auVar175._0_4_;
    auVar97._8_8_ = (auVar149._8_8_ & 0xffffffff) * (ulong)auVar175._8_4_;
    auVar176._0_8_ = (ulong)auVar175._4_4_ * (ulong)auVar149._4_4_;
    auVar176._8_8_ = (auVar175._8_8_ >> 0x20) * (auVar149._8_8_ >> 0x20);
    auVar98._0_4_ =
         (int)((ulong)(SUB168(auVar97 ^ auVar107,0) - auVar107._0_8_) >> 0x10) + auVar149._0_4_;
    auVar98._4_4_ =
         (int)((ulong)(SUB168(auVar176 ^ auVar169,0) - auVar169._0_8_) >> 0x10) + auVar149._4_4_;
    auVar98._8_4_ =
         (int)((ulong)(SUB168(auVar97 ^ auVar107,8) - auVar107._8_8_) >> 0x10) + auVar149._8_4_;
    auVar98._12_4_ =
         (int)((ulong)(SUB168(auVar176 ^ auVar169,8) - auVar169._8_8_) >> 0x10) + auVar149._12_4_;
    auVar108._0_4_ = (int)auVar59._0_2_ >> 0xf;
    auVar108._4_4_ = auVar38._0_4_ >> 0x1f;
    auVar150._0_8_ = CONCAT44(auVar108._0_4_,auVar108._0_4_);
    auVar150._8_4_ = auVar108._4_4_;
    auVar150._12_4_ = auVar108._4_4_;
    auVar162._0_8_ = CONCAT44(auVar108._8_4_,auVar108._8_4_);
    auVar162._8_4_ = auVar108._12_4_;
    auVar162._12_4_ = auVar108._12_4_;
    auVar170 = auVar170 ^ auVar108;
    auVar171._0_4_ = auVar170._0_4_ - auVar108._0_4_;
    auVar171._4_4_ = auVar170._4_4_ - auVar108._4_4_;
    auVar171._8_4_ = auVar170._8_4_ - auVar108._8_4_;
    auVar171._12_4_ = auVar170._12_4_ - auVar108._12_4_;
    auVar109._0_8_ = (ulong)auVar98._0_4_ * (ulong)auVar171._0_4_;
    auVar109._8_8_ = (auVar98._8_8_ & 0xffffffff) * (ulong)auVar171._8_4_;
    auVar172._0_8_ = (ulong)auVar171._4_4_ * (ulong)auVar98._4_4_;
    auVar172._8_8_ = (auVar171._8_8_ >> 0x20) * (auVar98._8_8_ >> 0x20);
    auVar136._0_4_ = iVar57 + iVar157;
    auVar136._4_4_ = iVar69 + auVar155._12_4_;
    auVar136._8_4_ = iVar71 + iVar157;
    auVar136._12_4_ = iVar72 + auVar155._12_4_;
    auVar99._0_8_ = CONCAT44(auVar96._8_4_,auVar96._8_4_);
    auVar99._8_4_ = auVar96._12_4_;
    auVar99._12_4_ = auVar96._12_4_;
    auVar110._0_8_ = CONCAT44(auVar96._8_4_,auVar96._8_4_);
    auVar110._8_4_ = auVar96._12_4_;
    auVar110._12_4_ = auVar96._12_4_;
    auVar127._0_4_ = (uVar158 ^ auVar96._8_4_) - auVar96._8_4_;
    auVar127._4_4_ = (auVar76._12_4_ ^ auVar96._12_4_) - auVar96._12_4_;
    auVar127._8_4_ = (uVar158 ^ auVar96._8_4_) - auVar96._8_4_;
    auVar127._12_4_ = (auVar76._12_4_ ^ auVar96._12_4_) - auVar96._12_4_;
    auVar78._0_8_ = (ulong)auVar136._0_4_ * (ulong)auVar127._0_4_;
    auVar78._8_8_ = (auVar136._8_8_ & 0xffffffff) * (ulong)auVar127._8_4_;
    auVar128._0_8_ = (ulong)auVar127._4_4_ * (ulong)auVar136._4_4_;
    auVar128._8_8_ = (auVar127._8_8_ >> 0x20) * (auVar136._8_8_ >> 0x20);
    auVar79._0_4_ =
         (int)((ulong)(SUB168(auVar78 ^ auVar99,0) - auVar99._0_8_) >> 0x10) + auVar136._0_4_;
    auVar79._4_4_ =
         (int)((ulong)(SUB168(auVar128 ^ auVar110,0) - auVar110._0_8_) >> 0x10) + auVar136._4_4_;
    auVar79._8_4_ =
         (int)((ulong)(SUB168(auVar78 ^ auVar99,8) - auVar99._8_8_) >> 0x10) + auVar136._8_4_;
    auVar79._12_4_ =
         (int)((ulong)(SUB168(auVar128 ^ auVar110,8) - auVar110._8_8_) >> 0x10) + auVar136._12_4_;
    auVar100._0_8_ = CONCAT44(auVar108._8_4_,auVar108._8_4_);
    auVar100._8_4_ = auVar108._12_4_;
    auVar100._12_4_ = auVar108._12_4_;
    auVar111._0_8_ = CONCAT44(auVar108._8_4_,auVar108._8_4_);
    auVar111._8_4_ = auVar108._12_4_;
    auVar111._12_4_ = auVar108._12_4_;
    auVar129._0_4_ = (uVar165 ^ auVar108._8_4_) - auVar108._8_4_;
    auVar129._4_4_ = (auVar125._12_4_ ^ auVar108._12_4_) - auVar108._12_4_;
    auVar129._8_4_ = (uVar165 ^ auVar108._8_4_) - auVar108._8_4_;
    auVar129._12_4_ = (auVar125._12_4_ ^ auVar108._12_4_) - auVar108._12_4_;
    auVar61._0_8_ = (ulong)auVar79._0_4_ * (ulong)auVar129._0_4_;
    auVar61._8_8_ = (auVar79._8_8_ & 0xffffffff) * (ulong)auVar129._8_4_;
    auVar130._0_8_ = (ulong)auVar129._4_4_ * (ulong)auVar79._4_4_;
    auVar130._8_8_ = (auVar129._8_8_ >> 0x20) * (auVar79._8_8_ >> 0x20);
    auVar163._0_4_ =
         ((uint)((ulong)(SUB168(auVar109 ^ auVar150,0) - auVar150._0_8_) >> 0x10) ^ uVar86) - uVar86
    ;
    auVar163._4_4_ =
         ((uint)((ulong)(SUB168(auVar172 ^ auVar162,0) - auVar162._0_8_) >> 0x10) ^ uVar92) - uVar92
    ;
    auVar163._8_4_ =
         ((uint)((ulong)(SUB168(auVar109 ^ auVar150,8) - auVar150._8_8_) >> 0x10) ^ uVar93) - uVar93
    ;
    auVar163._12_4_ =
         ((uint)((ulong)(SUB168(auVar172 ^ auVar162,8) - auVar162._8_8_) >> 0x10) ^ uVar94) - uVar94
    ;
    auVar62._0_4_ =
         ((uint)((ulong)(SUB168(auVar61 ^ auVar100,0) - auVar100._0_8_) >> 0x10) ^ uVar95) - uVar95;
    auVar62._4_4_ =
         ((uint)((ulong)(SUB168(auVar130 ^ auVar111,0) - auVar111._0_8_) >> 0x10) ^ uVar104) -
         uVar104;
    auVar62._8_4_ =
         ((uint)((ulong)(SUB168(auVar61 ^ auVar100,8) - auVar100._8_8_) >> 0x10) ^ uVar105) -
         uVar105;
    auVar62._12_4_ =
         ((uint)((ulong)(SUB168(auVar130 ^ auVar111,8) - auVar111._8_8_) >> 0x10) ^ uVar106) -
         uVar106;
    auVar60 = auVar60 & auVar163;
    auVar145 = auVar145 & auVar62;
    *(undefined1 (*) [16])qcoeff_ptr = auVar60;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar145;
    auVar87._0_4_ = auVar60._0_4_ >> 0x1f;
    auVar87._4_4_ = auVar60._4_4_ >> 0x1f;
    auVar87._8_4_ = auVar60._8_4_ >> 0x1f;
    auVar87._12_4_ = auVar60._12_4_ >> 0x1f;
    auVar60 = auVar60 ^ auVar87;
    auVar117._0_4_ = auVar60._0_4_ - auVar87._0_4_;
    auVar117._4_4_ = auVar60._4_4_ - auVar87._4_4_;
    auVar117._8_4_ = auVar60._8_4_ - auVar87._8_4_;
    auVar117._12_4_ = auVar60._12_4_ - auVar87._12_4_;
    auVar80._0_4_ = (int)auVar173._0_2_ >> 0xf;
    auVar80._4_4_ = auVar37._0_4_ >> 0x1f;
    auVar101._0_8_ = CONCAT44(auVar80._0_4_,auVar80._0_4_);
    auVar101._8_4_ = auVar80._4_4_;
    auVar101._12_4_ = auVar80._4_4_;
    auVar112._0_8_ = CONCAT44(auVar80._8_4_,auVar80._8_4_);
    auVar112._8_4_ = auVar80._12_4_;
    auVar112._12_4_ = auVar80._12_4_;
    auVar58 = auVar58 ^ auVar80;
    auVar63._0_4_ = auVar58._0_4_ - auVar80._0_4_;
    auVar63._4_4_ = auVar58._4_4_ - auVar80._4_4_;
    auVar63._8_4_ = auVar58._8_4_ - auVar80._8_4_;
    auVar63._12_4_ = auVar58._12_4_ - auVar80._12_4_;
    auVar131._0_8_ = (ulong)auVar117._0_4_ * (ulong)auVar63._0_4_;
    auVar131._8_8_ = (auVar117._8_8_ & 0xffffffff) * (ulong)auVar63._8_4_;
    auVar64._0_8_ = (ulong)auVar63._4_4_ * (ulong)auVar117._4_4_;
    auVar64._8_8_ = (auVar63._8_8_ >> 0x20) * (auVar117._8_8_ >> 0x20);
    auVar132._0_8_ = SUB168(auVar131 ^ auVar101,0) - auVar101._0_8_;
    auVar132._8_8_ = SUB168(auVar131 ^ auVar101,8) - auVar101._8_8_;
    auVar65._0_8_ = SUB168(auVar64 ^ auVar112,0) - auVar112._0_8_ << 0x20;
    auVar65._8_8_ = SUB168(auVar64 ^ auVar112,8) - auVar112._8_8_ << 0x20;
    auVar58 = (auVar65 | auVar132 & _DAT_00515660) ^ auVar87;
    auVar88._0_4_ = auVar145._0_4_ >> 0x1f;
    auVar88._4_4_ = auVar145._4_4_ >> 0x1f;
    auVar88._8_4_ = auVar145._8_4_ >> 0x1f;
    auVar88._12_4_ = auVar145._12_4_ >> 0x1f;
    auVar145 = auVar145 ^ auVar88;
    auVar146._0_4_ = auVar145._0_4_ - auVar88._0_4_;
    auVar146._4_4_ = auVar145._4_4_ - auVar88._4_4_;
    auVar146._8_4_ = auVar145._8_4_ - auVar88._8_4_;
    auVar146._12_4_ = auVar145._12_4_ - auVar88._12_4_;
    auVar113._0_8_ = CONCAT44(auVar80._8_4_,auVar80._8_4_);
    auVar113._8_4_ = auVar80._12_4_;
    auVar113._12_4_ = auVar80._12_4_;
    auVar118._0_8_ = CONCAT44(auVar80._8_4_,auVar80._8_4_);
    auVar118._8_4_ = auVar80._12_4_;
    auVar118._12_4_ = auVar80._12_4_;
    auVar133._0_4_ = (uVar166 ^ auVar80._8_4_) - auVar80._8_4_;
    auVar133._4_4_ = (auVar160._12_4_ ^ auVar80._12_4_) - auVar80._12_4_;
    auVar133._8_4_ = (uVar166 ^ auVar80._8_4_) - auVar80._8_4_;
    auVar133._12_4_ = (auVar160._12_4_ ^ auVar80._12_4_) - auVar80._12_4_;
    auVar102._0_8_ = (ulong)auVar146._0_4_ * (ulong)auVar133._0_4_;
    auVar102._8_8_ = (auVar146._8_8_ & 0xffffffff) * (ulong)auVar133._8_4_;
    auVar134._0_8_ = (ulong)auVar133._4_4_ * (ulong)auVar146._4_4_;
    auVar134._8_8_ = (auVar133._8_8_ >> 0x20) * (auVar146._8_8_ >> 0x20);
    auVar103._0_8_ = SUB168(auVar102 ^ auVar113,0) - auVar113._0_8_;
    auVar103._8_8_ = SUB168(auVar102 ^ auVar113,8) - auVar113._8_8_;
    auVar135._0_8_ = SUB168(auVar134 ^ auVar118,0) - auVar118._0_8_ << 0x20;
    auVar135._8_8_ = SUB168(auVar134 ^ auVar118,8) - auVar118._8_8_ << 0x20;
    auVar136 = (auVar135 | auVar103 & _DAT_00515660) ^ auVar88;
    *dqcoeff_ptr = auVar58._0_4_ - auVar87._0_4_;
    dqcoeff_ptr[1] = auVar58._4_4_ - auVar87._4_4_;
    dqcoeff_ptr[2] = auVar58._8_4_ - auVar87._8_4_;
    dqcoeff_ptr[3] = auVar58._12_4_ - auVar87._12_4_;
    dqcoeff_ptr[4] = auVar136._0_4_ - auVar88._0_4_;
    dqcoeff_ptr[5] = auVar136._4_4_ - auVar88._4_4_;
    dqcoeff_ptr[6] = auVar136._8_4_ - auVar88._8_4_;
    dqcoeff_ptr[7] = auVar136._12_4_ - auVar88._12_4_;
  }
  local_148._2_2_ = (ushort)(-1 < (short)local_148._2_2_) * local_148._2_2_;
  local_148._0_2_ = (ushort)(-1 < (short)local_148._0_2_) * local_148._0_2_;
  local_148._4_2_ = (ushort)(-1 < (short)local_148._4_2_) * local_148._4_2_;
  local_148._6_2_ = (ushort)(-1 < (short)local_148._6_2_) * local_148._6_2_;
  local_148._8_2_ = (ushort)(-1 < (short)local_148._8_2_) * local_148._8_2_;
  local_148._10_2_ = (ushort)(-1 < (short)local_148._10_2_) * local_148._10_2_;
  local_148._12_2_ = (ushort)(-1 < (short)local_148._12_2_) * local_148._12_2_;
  local_148._14_2_ = (ushort)(-1 < (short)local_148._14_2_) * local_148._14_2_;
  uVar46 = (ushort)(-1 < auVar47._0_2_) * auVar47._0_2_;
  uVar48 = (ushort)(-1 < auVar47._2_2_) * auVar47._2_2_;
  uVar49 = (ushort)(-1 < auVar47._4_2_) * auVar47._4_2_;
  uVar51 = (ushort)(-1 < auVar47._6_2_) * auVar47._6_2_;
  uVar52 = (ushort)(-1 < auVar47._8_2_) * auVar47._8_2_;
  uVar53 = (ushort)(-1 < auVar47._10_2_) * auVar47._10_2_;
  uVar54 = (ushort)(-1 < auVar47._12_2_) * auVar47._12_2_;
  uVar55 = (ushort)(-1 < auVar47._14_2_) * auVar47._14_2_;
  if (8 < n_coeffs) {
    uVar95 = (uVar158 ^ auVar96._8_4_) - auVar96._8_4_;
    uVar104 = (auVar76._12_4_ ^ auVar96._12_4_) - auVar96._12_4_;
    uVar105 = (uVar158 ^ auVar96._8_4_) - auVar96._8_4_;
    uVar106 = (auVar76._12_4_ ^ auVar96._12_4_) - auVar96._12_4_;
    uVar86 = (uVar165 ^ auVar108._8_4_) - auVar108._8_4_;
    uVar92 = (auVar125._12_4_ ^ auVar108._12_4_) - auVar108._12_4_;
    uVar93 = (uVar165 ^ auVar108._8_4_) - auVar108._8_4_;
    uVar94 = (auVar125._12_4_ ^ auVar108._12_4_) - auVar108._12_4_;
    uVar158 = (uVar166 ^ auVar80._8_4_) - auVar80._8_4_;
    uVar165 = (auVar160._12_4_ ^ auVar80._12_4_) - auVar80._12_4_;
    uVar166 = (uVar166 ^ auVar80._8_4_) - auVar80._8_4_;
    uVar167 = (auVar160._12_4_ ^ auVar80._12_4_) - auVar80._12_4_;
    lVar40 = 8;
    uVar44 = CONCAT44(auVar96._8_4_,auVar96._8_4_);
    uVar43 = CONCAT44(auVar96._12_4_,auVar96._12_4_);
    do {
      puVar1 = (uint *)(coeff_ptr + lVar40);
      puVar3 = (uint *)(coeff_ptr + lVar40 + 4);
      uVar140 = (int)*puVar1 >> 0x1f;
      uVar142 = (int)puVar1[1] >> 0x1f;
      uVar143 = (int)puVar1[2] >> 0x1f;
      uVar144 = (int)puVar1[3] >> 0x1f;
      uVar123 = (int)*puVar3 >> 0x1f;
      uVar137 = (int)puVar3[1] >> 0x1f;
      uVar138 = (int)puVar3[2] >> 0x1f;
      uVar139 = (int)puVar3[3] >> 0x1f;
      iVar57 = (*puVar1 ^ uVar140) - uVar140;
      iVar69 = (puVar1[1] ^ uVar142) - uVar142;
      iVar71 = (puVar1[2] ^ uVar143) - uVar143;
      iVar72 = (puVar1[3] ^ uVar144) - uVar144;
      iVar148 = (*puVar3 ^ uVar123) - uVar123;
      iVar151 = (puVar3[1] ^ uVar137) - uVar137;
      iVar152 = (puVar3[2] ^ uVar138) - uVar138;
      iVar153 = (puVar3[3] ^ uVar139) - uVar139;
      auVar66._0_4_ = -(uint)(iVar50 < iVar57 * 0x20);
      auVar66._4_4_ = -(uint)(iVar50 < iVar69 * 0x20);
      auVar66._8_4_ = -(uint)(iVar50 < iVar71 * 0x20);
      auVar66._12_4_ = -(uint)(iVar50 < iVar72 * 0x20);
      auVar81._0_4_ = -(uint)(iVar50 < iVar148 * 0x20);
      auVar81._4_4_ = -(uint)(iVar50 < iVar151 * 0x20);
      auVar81._8_4_ = -(uint)(iVar50 < iVar152 * 0x20);
      auVar81._12_4_ = -(uint)(iVar50 < iVar153 * 0x20);
      auVar58 = packssdw(auVar66,auVar81);
      auVar136 = (undefined1  [16])0x0;
      if ((((((((((((((((auVar58 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar58 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar58 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar58 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar58 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar58 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar58 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar58 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar58 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar58 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar58 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar58 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar58[0xf] < '\0'
         ) {
        auVar136 = auVar58 & *(undefined1 (*) [16])(iscan + lVar40);
        bVar45 = true;
      }
      auVar114._0_4_ = -(uint)(iVar73 < iVar57);
      auVar114._4_4_ = -(uint)(iVar74 < iVar69);
      auVar114._8_4_ = -(uint)(iVar73 < iVar71);
      auVar114._12_4_ = -(uint)(iVar74 < iVar72);
      auVar89._0_4_ = -(uint)(iVar73 < iVar148);
      auVar89._4_4_ = -(uint)(iVar74 < iVar151);
      auVar89._8_4_ = -(uint)(iVar73 < iVar152);
      auVar89._12_4_ = -(uint)(iVar74 < iVar153);
      auVar58 = packssdw(auVar114,auVar89);
      uVar56 = (ushort)(SUB161(auVar58 >> 7,0) & 1) | (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar58[0xf] >> 7) << 0xf;
      if (uVar56 == 0) {
        auVar58 = (undefined1  [16])0x0;
      }
      else {
        auVar58 = auVar58 & *(undefined1 (*) [16])(iscan + lVar40);
        bVar12 = true;
      }
      iVar39 = movmskps((uint)uVar56,auVar89 | auVar114);
      if (iVar39 == 0) {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar40 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar40) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar40 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar40) = (undefined1  [16])0x0;
      }
      else {
        auVar119._0_4_ = iVar57 + iVar157;
        auVar119._4_4_ = iVar69 + auVar155._12_4_;
        auVar119._8_4_ = iVar71 + iVar157;
        auVar119._12_4_ = iVar72 + auVar155._12_4_;
        uVar32 = CONCAT44(auVar96._8_4_,auVar96._8_4_);
        uVar33 = CONCAT44(auVar96._12_4_,auVar96._12_4_);
        auVar82._0_4_ =
             (int)(((ulong)auVar119._0_4_ * (ulong)uVar95 ^ uVar44) - uVar44 >> 0x10) +
             auVar119._0_4_;
        auVar82._4_4_ =
             (int)(((ulong)auVar119._4_4_ * (ulong)uVar104 ^ uVar32) - uVar32 >> 0x10) +
             auVar119._4_4_;
        auVar82._8_4_ =
             (int)(((auVar119._8_8_ & 0xffffffff) * (ulong)uVar105 ^ uVar43) - uVar43 >> 0x10) +
             auVar119._8_4_;
        auVar82._12_4_ =
             (int)(((auVar119._8_8_ >> 0x20) * (ulong)uVar106 ^ uVar33) - uVar33 >> 0x10) +
             auVar119._12_4_;
        uVar28 = CONCAT44(auVar108._8_4_,auVar108._8_4_);
        uVar29 = CONCAT44(auVar108._12_4_,auVar108._12_4_);
        uVar30 = CONCAT44(auVar108._8_4_,auVar108._8_4_);
        uVar31 = CONCAT44(auVar108._12_4_,auVar108._12_4_);
        auVar164._0_4_ = iVar148 + iVar157;
        auVar164._4_4_ = iVar151 + auVar155._12_4_;
        auVar164._8_4_ = iVar152 + iVar157;
        auVar164._12_4_ = iVar153 + auVar155._12_4_;
        auVar83._0_4_ =
             (int)(((ulong)auVar164._0_4_ * (ulong)uVar95 ^ uVar44) - uVar44 >> 0x10) +
             auVar164._0_4_;
        auVar83._4_4_ =
             (int)(((ulong)auVar164._4_4_ * (ulong)uVar104 ^ uVar32) - uVar32 >> 0x10) +
             auVar164._4_4_;
        auVar83._8_4_ =
             (int)(((auVar164._8_8_ & 0xffffffff) * (ulong)uVar105 ^ uVar43) - uVar43 >> 0x10) +
             auVar164._8_4_;
        auVar83._12_4_ =
             (int)(((auVar164._8_8_ >> 0x20) * (ulong)uVar106 ^ uVar33) - uVar33 >> 0x10) +
             auVar164._12_4_;
        auVar147._0_4_ =
             ((uint)(((ulong)auVar82._0_4_ * (ulong)uVar86 ^ uVar28) - uVar28 >> 0x10) ^ uVar140) -
             uVar140;
        auVar147._4_4_ =
             ((uint)(((ulong)auVar82._4_4_ * (ulong)uVar92 ^ uVar30) - uVar30 >> 0x10) ^ uVar142) -
             uVar142;
        auVar147._8_4_ =
             ((uint)(((auVar82._8_8_ & 0xffffffff) * (ulong)uVar93 ^ uVar29) - uVar29 >> 0x10) ^
             uVar143) - uVar143;
        auVar147._12_4_ =
             ((uint)(((auVar82._8_8_ >> 0x20) * (ulong)uVar94 ^ uVar31) - uVar31 >> 0x10) ^ uVar144)
             - uVar144;
        auVar120._0_4_ =
             ((uint)(((ulong)auVar83._0_4_ * (ulong)uVar86 ^ uVar28) - uVar28 >> 0x10) ^ uVar123) -
             uVar123;
        auVar120._4_4_ =
             ((uint)(((ulong)auVar83._4_4_ * (ulong)uVar92 ^ uVar30) - uVar30 >> 0x10) ^ uVar137) -
             uVar137;
        auVar120._8_4_ =
             ((uint)(((auVar83._8_8_ & 0xffffffff) * (ulong)uVar93 ^ uVar29) - uVar29 >> 0x10) ^
             uVar138) - uVar138;
        auVar120._12_4_ =
             ((uint)(((auVar83._8_8_ >> 0x20) * (ulong)uVar94 ^ uVar31) - uVar31 >> 0x10) ^ uVar139)
             - uVar139;
        auVar114 = auVar114 & auVar147;
        auVar89 = auVar89 & auVar120;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar40) = auVar114;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar40 + 4) = auVar89;
        auVar84._0_4_ = auVar114._0_4_ >> 0x1f;
        auVar84._4_4_ = auVar114._4_4_ >> 0x1f;
        auVar84._8_4_ = auVar114._8_4_ >> 0x1f;
        auVar84._12_4_ = auVar114._12_4_ >> 0x1f;
        auVar114 = auVar114 ^ auVar84;
        auVar115._0_4_ = auVar114._0_4_ - auVar84._0_4_;
        auVar115._4_4_ = auVar114._4_4_ - auVar84._4_4_;
        auVar115._8_4_ = auVar114._8_4_ - auVar84._8_4_;
        auVar115._12_4_ = auVar114._12_4_ - auVar84._12_4_;
        uVar30 = CONCAT44(auVar80._8_4_,auVar80._8_4_);
        uVar31 = CONCAT44(auVar80._12_4_,auVar80._12_4_);
        auVar121._0_8_ = ((ulong)auVar115._0_4_ * (ulong)uVar158 ^ uVar30) - uVar30;
        auVar121._8_8_ = ((auVar115._8_8_ & 0xffffffff) * (ulong)uVar166 ^ uVar31) - uVar31;
        uVar28 = (ulong)auVar80._8_4_;
        uVar29 = (ulong)auVar80._12_4_;
        auVar116._0_8_ = ((ulong)auVar115._4_4_ * (ulong)uVar165 ^ uVar28) - uVar28 << 0x20;
        auVar116._8_8_ = ((auVar115._8_8_ >> 0x20) * (ulong)uVar167 ^ uVar29) - uVar29 << 0x20;
        auVar47 = (auVar116 | auVar121 & _DAT_00515660) ^ auVar84;
        auVar85._0_4_ = auVar89._0_4_ >> 0x1f;
        auVar85._4_4_ = auVar89._4_4_ >> 0x1f;
        auVar85._8_4_ = auVar89._8_4_ >> 0x1f;
        auVar85._12_4_ = auVar89._12_4_ >> 0x1f;
        auVar89 = auVar89 ^ auVar85;
        auVar90._0_4_ = auVar89._0_4_ - auVar85._0_4_;
        auVar90._4_4_ = auVar89._4_4_ - auVar85._4_4_;
        auVar90._8_4_ = auVar89._8_4_ - auVar85._8_4_;
        auVar90._12_4_ = auVar89._12_4_ - auVar85._12_4_;
        auVar122._0_8_ = ((ulong)auVar90._0_4_ * (ulong)uVar158 ^ uVar30) - uVar30;
        auVar122._8_8_ = ((auVar90._8_8_ & 0xffffffff) * (ulong)uVar166 ^ uVar31) - uVar31;
        auVar91._0_8_ = ((ulong)auVar90._4_4_ * (ulong)uVar165 ^ uVar28) - uVar28 << 0x20;
        auVar91._8_8_ = ((auVar90._8_8_ >> 0x20) * (ulong)uVar167 ^ uVar29) - uVar29 << 0x20;
        auVar174 = (auVar91 | auVar122 & _DAT_00515660) ^ auVar85;
        piVar2 = dqcoeff_ptr + lVar40;
        *piVar2 = auVar47._0_4_ - auVar84._0_4_;
        piVar2[1] = auVar47._4_4_ - auVar84._4_4_;
        piVar2[2] = auVar47._8_4_ - auVar84._8_4_;
        piVar2[3] = auVar47._12_4_ - auVar84._12_4_;
        piVar2 = dqcoeff_ptr + lVar40 + 4;
        *piVar2 = auVar174._0_4_ - auVar85._0_4_;
        piVar2[1] = auVar174._4_4_ - auVar85._4_4_;
        piVar2[2] = auVar174._8_4_ - auVar85._8_4_;
        piVar2[3] = auVar174._12_4_ - auVar85._12_4_;
      }
      sVar4 = auVar136._0_2_;
      sVar5 = auVar136._2_2_;
      sVar6 = auVar136._4_2_;
      sVar7 = auVar136._6_2_;
      sVar8 = auVar136._8_2_;
      sVar9 = auVar136._10_2_;
      sVar10 = auVar136._12_2_;
      sVar11 = auVar136._14_2_;
      local_148._2_2_ =
           (ushort)((short)local_148._2_2_ < sVar5) * sVar5 |
           (ushort)((short)local_148._2_2_ >= sVar5) * local_148._2_2_;
      local_148._0_2_ =
           (ushort)((short)local_148._0_2_ < sVar4) * sVar4 |
           (ushort)((short)local_148._0_2_ >= sVar4) * local_148._0_2_;
      local_148._4_2_ =
           (ushort)((short)local_148._4_2_ < sVar6) * sVar6 |
           (ushort)((short)local_148._4_2_ >= sVar6) * local_148._4_2_;
      local_148._6_2_ =
           (ushort)((short)local_148._6_2_ < sVar7) * sVar7 |
           (ushort)((short)local_148._6_2_ >= sVar7) * local_148._6_2_;
      local_148._8_2_ =
           (ushort)((short)local_148._8_2_ < sVar8) * sVar8 |
           (ushort)((short)local_148._8_2_ >= sVar8) * local_148._8_2_;
      local_148._10_2_ =
           (ushort)((short)local_148._10_2_ < sVar9) * sVar9 |
           (ushort)((short)local_148._10_2_ >= sVar9) * local_148._10_2_;
      local_148._12_2_ =
           (ushort)((short)local_148._12_2_ < sVar10) * sVar10 |
           (ushort)((short)local_148._12_2_ >= sVar10) * local_148._12_2_;
      local_148._14_2_ =
           (ushort)((short)local_148._14_2_ < sVar11) * sVar11 |
           (ushort)((short)local_148._14_2_ >= sVar11) * local_148._14_2_;
      sVar4 = auVar58._0_2_;
      uVar46 = (ushort)((short)uVar46 < sVar4) * sVar4 | ((short)uVar46 >= sVar4) * uVar46;
      sVar4 = auVar58._2_2_;
      uVar48 = (ushort)((short)uVar48 < sVar4) * sVar4 | ((short)uVar48 >= sVar4) * uVar48;
      sVar4 = auVar58._4_2_;
      uVar49 = (ushort)((short)uVar49 < sVar4) * sVar4 | ((short)uVar49 >= sVar4) * uVar49;
      sVar4 = auVar58._6_2_;
      uVar51 = (ushort)((short)uVar51 < sVar4) * sVar4 | ((short)uVar51 >= sVar4) * uVar51;
      sVar4 = auVar58._8_2_;
      uVar52 = (ushort)((short)uVar52 < sVar4) * sVar4 | ((short)uVar52 >= sVar4) * uVar52;
      sVar4 = auVar58._10_2_;
      uVar53 = (ushort)((short)uVar53 < sVar4) * sVar4 | ((short)uVar53 >= sVar4) * uVar53;
      sVar4 = auVar58._12_2_;
      uVar54 = (ushort)((short)uVar54 < sVar4) * sVar4 | ((short)uVar54 >= sVar4) * uVar54;
      sVar4 = auVar58._14_2_;
      uVar55 = (ushort)((short)uVar55 < sVar4) * sVar4 | ((short)uVar55 >= sVar4) * uVar55;
      lVar40 = lVar40 + 8;
    } while (lVar40 < n_coeffs);
  }
  if (bVar45) {
    uVar56 = (ushort)((short)local_148._8_2_ < (short)local_148._0_2_) * local_148._0_2_ |
             (ushort)((short)local_148._8_2_ >= (short)local_148._0_2_) * local_148._8_2_;
    uVar67 = (ushort)((short)local_148._10_2_ < (short)local_148._2_2_) * local_148._2_2_ |
             (ushort)((short)local_148._10_2_ >= (short)local_148._2_2_) * local_148._10_2_;
    uVar68 = (ushort)((short)local_148._12_2_ < (short)local_148._4_2_) * local_148._4_2_ |
             (ushort)((short)local_148._12_2_ >= (short)local_148._4_2_) * local_148._12_2_;
    uVar70 = (ushort)((short)local_148._14_2_ < (short)local_148._6_2_) * local_148._6_2_ |
             (ushort)((short)local_148._14_2_ >= (short)local_148._6_2_) * local_148._14_2_;
    uVar56 = ((short)uVar68 < (short)uVar56) * uVar56 | ((short)uVar68 >= (short)uVar56) * uVar68;
    uVar67 = ((short)uVar70 < (short)uVar67) * uVar67 | ((short)uVar70 >= (short)uVar67) * uVar70;
    uVar86 = (ushort)(((short)uVar67 < (short)uVar56) * uVar56 |
                     ((short)uVar67 >= (short)uVar56) * uVar67) + 1;
  }
  else {
    uVar86 = 0;
  }
  if (bVar12) {
    uVar52 = ((short)uVar52 < (short)uVar46) * uVar46 | ((short)uVar52 >= (short)uVar46) * uVar52;
    uVar53 = ((short)uVar53 < (short)uVar48) * uVar48 | ((short)uVar53 >= (short)uVar48) * uVar53;
    uVar48 = ((short)uVar54 < (short)uVar49) * uVar49 | ((short)uVar54 >= (short)uVar49) * uVar54;
    uVar49 = ((short)uVar55 < (short)uVar51) * uVar51 | ((short)uVar55 >= (short)uVar51) * uVar55;
    uVar48 = ((short)uVar48 < (short)uVar52) * uVar52 | ((short)uVar48 >= (short)uVar52) * uVar48;
    uVar49 = ((short)uVar49 < (short)uVar53) * uVar53 | ((short)uVar49 >= (short)uVar53) * uVar49;
    uVar92 = (uint)(ushort)(((short)uVar49 < (short)uVar48) * uVar48 |
                           ((short)uVar49 >= (short)uVar48) * uVar49);
  }
  else {
    uVar92 = 0xffffffff;
  }
  if ((int)uVar86 <= (int)uVar92) {
    iVar50 = uVar92 + 1;
    psVar42 = scan + uVar92;
    do {
      sVar4 = *psVar42;
      qcoeff_ptr[sVar4] = 0;
      dqcoeff_ptr[sVar4] = 0;
      iVar50 = iVar50 + -1;
      psVar42 = psVar42 + -1;
    } while ((int)uVar86 < iVar50);
  }
  uVar43 = 0xffffffff;
  uVar44 = (ulong)uVar86;
  do {
    iVar50 = (int)uVar43;
    if ((long)uVar44 < 1) break;
    lVar40 = uVar44 - 1;
    uVar44 = uVar44 - 1;
    if (qcoeff_ptr[scan[lVar40]] != 0) {
      uVar43 = uVar44 & 0xffffffff;
    }
    iVar50 = (int)uVar43;
  } while (qcoeff_ptr[scan[lVar40]] == 0);
  uVar41 = (uint16_t)(iVar50 + 1U);
  *eob_ptr = uVar41;
  if (uVar86 == 0) {
    uVar92 = 0xffffffff;
  }
  else {
    lVar40 = 0;
    do {
      uVar92 = (uint)lVar40;
      if (qcoeff_ptr[scan[lVar40]] != 0) break;
      bVar45 = (ulong)uVar86 - 1 != lVar40;
      lVar40 = lVar40 + 1;
      uVar92 = 0xffffffff;
    } while (bVar45);
  }
  if ((uVar41 != 0) && (uVar86 = (iVar50 + 1U & 0xffff) - 1, uVar92 == uVar86)) {
    sVar4 = scan[uVar86];
    if (((qcoeff_ptr[sVar4] == 1) || (qcoeff_ptr[sVar4] == -1)) &&
       (uVar86 = coeff_ptr[sVar4] >> 0x1f, uVar44 = (ulong)((uint)(sVar4 != 0) * 2),
       (int)((coeff_ptr[sVar4] << 5 ^ uVar86) - uVar86) <
       *(short *)((long)zbin_ptr + uVar44) * 0x20 +
       (*(short *)((long)dequant_ptr + uVar44) * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar4] = 0;
      dqcoeff_ptr[sVar4] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 0;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}